

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.cpp
# Opt level: O2

pointer __thiscall
stream::chunk_reader::get(chunk_reader *this,slice_reader *base,chunk *chunk,string *key)

{
  uint uVar1;
  long *plVar2;
  EVP_PKEY_CTX *ctx;
  long lVar3;
  bool bVar4;
  iterator __tmp;
  ssize_t sVar5;
  chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *this_00;
  linked_streambuf<char,_std::char_traits<char>_> *plVar6;
  long lVar7;
  chunk_error *pcVar8;
  string *__nbytes;
  long *plVar9;
  char magic [4];
  char salt [8];
  string local_2f0 [8];
  checksum checksum;
  hasher hasher;
  arc4 local_140;
  
  __nbytes = key;
  bVar4 = slice_reader::seek(base,(ulong)chunk->first_slice,chunk->offset);
  if (!bVar4) {
    pcVar8 = (chunk_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f0,"could not seek to chunk start",(allocator<char> *)&local_140);
    chunk_error::chunk_error(pcVar8,local_2f0);
    __cxa_throw(pcVar8,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  sVar5 = slice_reader::read(base,(int)magic,(void *)0x4,(size_t)__nbytes);
  if ((sVar5 != 4) || (magic != (char  [4])0x1a626c7a)) {
    pcVar8 = (chunk_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f0,"bad chunk magic",(allocator<char> *)&local_140);
    chunk_error::chunk_error(pcVar8,local_2f0);
    __cxa_throw(pcVar8,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  this_00 = (chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
             *)operator_new(0x10);
  boost::iostreams::detail::
  chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
  ::chain_base((chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
                *)this_00);
  *(chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    **)this = this_00;
  switch(chunk->compression) {
  case Stored:
    goto switchD_001401ef_caseD_0;
  case Zlib:
    boost::iostreams::basic_zlib_decompressor<std::allocator<char>_>::basic_zlib_decompressor
              ((basic_zlib_decompressor<std::allocator<char>_> *)local_2f0,0xf,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push_impl<boost::iostreams::basic_zlib_decompressor<std::allocator<char>>>
              (this_00,(basic_zlib_decompressor<std::allocator<char>_> *)local_2f0,0x2000,-1);
    break;
  case BZip2:
    boost::iostreams::basic_bzip2_decompressor<std::allocator<char>_>::basic_bzip2_decompressor
              ((basic_bzip2_decompressor<std::allocator<char>_> *)local_2f0,false,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push_impl<boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>>
              (this_00,(basic_bzip2_decompressor<std::allocator<char>_> *)local_2f0,0x2000,-1);
    break;
  case LZMA1:
    boost::iostreams::symmetric_filter<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
    ::symmetric_filter((symmetric_filter<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
                        *)local_2f0,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::
    push_impl<stream::lzma_decompressor<stream::inno_lzma1_decompressor_impl,std::allocator<char>>>
              (this_00,(lzma_decompressor<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
                        *)local_2f0,0x2000,-1);
    break;
  case LZMA2:
    boost::iostreams::symmetric_filter<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
    ::symmetric_filter((symmetric_filter<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
                        *)local_2f0,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::
    push_impl<stream::lzma_decompressor<stream::inno_lzma2_decompressor_impl,std::allocator<char>>>
              (this_00,(lzma_decompressor<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
                        *)local_2f0,0x2000,-1);
    break;
  default:
    pcVar8 = (chunk_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f0,"unknown chunk compression",(allocator<char> *)&local_140);
    chunk_error::chunk_error(pcVar8,local_2f0);
    __cxa_throw(pcVar8,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  boost::detail::shared_count::~shared_count((shared_count *)&local_2f0[0]._M_string_length);
switchD_001401ef_caseD_0:
  uVar1 = chunk->encryption - ARC4_MD5;
  if (uVar1 < 2) {
    sVar5 = slice_reader::read(base,(int)salt,(void *)0x8,(ulong)uVar1);
    if (sVar5 != 8) {
      pcVar8 = (chunk_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2f0,"could not read chunk salt",(allocator<char> *)&local_140);
      chunk_error::chunk_error(pcVar8,local_2f0);
      __cxa_throw(pcVar8,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    crypto::hasher::hasher(&hasher,(chunk->encryption == ARC4_SHA1) + MD5);
    crypto::hasher::update(&hasher,salt,8);
    crypto::hasher::update(&hasher,(key->_M_dataplus)._M_p,key->_M_string_length);
    crypto::hasher::finalize(&checksum,&hasher);
    crypto::arc4::init(&local_140,(EVP_PKEY_CTX *)&checksum);
    crypto::arc4::discard(&local_140,1000);
    plVar2 = *(long **)this_00;
    if ((*(byte *)(plVar2 + 7) & 1) != 0) {
      std::logic_error::logic_error((logic_error *)local_2f0,"chain complete");
      boost::throw_exception<std::logic_error>((logic_error *)local_2f0);
    }
    if ((long *)*plVar2 == plVar2) {
      plVar9 = (long *)0x0;
    }
    else {
      plVar9 = *(long **)(plVar2[1] + 0x10);
    }
    lVar3 = plVar2[6];
    plVar6 = (linked_streambuf<char,_std::char_traits<char>_> *)operator_new(0x188);
    boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>::linked_streambuf
              (plVar6);
    plVar6[4].field_0x38 = 0;
    *(undefined8 *)&plVar6[5].field_0x8 = 0;
    *(undefined8 *)&plVar6[4].flags_ = 0;
    *(undefined8 *)(plVar6 + 5) = 0;
    *(undefined4 *)&plVar6[5].field_0x18 = 4;
    *(undefined ***)plVar6 = &PTR__stream_buffer_0016fa38;
    memcpy(local_2f0,&local_140,0x110);
    lVar7 = 2;
    if (2 < lVar3) {
      lVar7 = lVar3;
    }
    if (lVar3 == -1) {
      lVar7 = 4;
    }
    *(long *)&plVar6[5].field_0x10 = lVar7;
    boost::iostreams::detail::basic_buffer<char,_std::allocator<char>_>::resize
              ((basic_buffer<char,_std::allocator<char>_> *)(plVar6 + 5),(long)((int)lVar7 + 0x2000)
              );
    (**(code **)(*(long *)plVar6 + 0xa8))(plVar6);
    memcpy(plVar6 + 1,local_2f0,0x110);
    plVar6[4].field_0x38 = 1;
    plVar6[5].field_0x18 = plVar6[5].field_0x18 | 1;
    (&plVar6->field_0x28)[0x18] = (byte)*(int *)(&plVar6->field_0x28 + 0x18) & 0xf8;
    local_2f0[0]._M_dataplus._M_p = (pointer)plVar6;
    std::__cxx11::
    list<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*>_>
    ::push_back(*(list<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*>_>
                  **)this_00,(value_type *)local_2f0);
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 0x70))(plVar9,*(undefined8 *)(*(long *)(*(long *)this_00 + 8) + 0x10));
    }
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
    ::notify((chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
              *)this_00);
  }
  else if (chunk->encryption == XChaCha20) {
    if (key->_M_string_length != 0x38) {
      pcVar8 = (chunk_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2f0,"unexpected key size",(allocator<char> *)&local_140);
      chunk_error::chunk_error(pcVar8,local_2f0);
      __cxa_throw(pcVar8,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    ctx = (EVP_PKEY_CTX *)(key->_M_dataplus)._M_p;
    hasher.field_1._12_8_ = *(undefined8 *)(ctx + 0x30);
    hasher._0_8_ = *(ulong *)(ctx + 0x20) ^ (ulong)chunk->offset;
    hasher.field_1._4_4_ = (undefined4)*(undefined8 *)(ctx + 0x28);
    hasher.field_1._8_4_ = (undefined4)((ulong)*(undefined8 *)(ctx + 0x28) >> 0x20);
    hasher.field_1._4_4_ = hasher.field_1._4_4_ ^ chunk->first_slice;
    crypto::xchacha20::init((xchacha20 *)&local_140,ctx);
    plVar2 = *(long **)this_00;
    if ((*(byte *)(plVar2 + 7) & 1) != 0) {
      std::logic_error::logic_error((logic_error *)local_2f0,"chain complete");
      boost::throw_exception<std::logic_error>((logic_error *)local_2f0);
    }
    if ((long *)*plVar2 == plVar2) {
      plVar9 = (long *)0x0;
    }
    else {
      plVar9 = *(long **)(plVar2[1] + 0x10);
    }
    lVar3 = plVar2[6];
    plVar6 = (linked_streambuf<char,_std::char_traits<char>_> *)operator_new(0xf8);
    boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>::linked_streambuf
              (plVar6);
    plVar6[2].field_0x38 = 0;
    *(undefined8 *)&plVar6[3].field_0x8 = 0;
    *(undefined8 *)&plVar6[2].flags_ = 0;
    *(undefined8 *)(plVar6 + 3) = 0;
    *(undefined4 *)&plVar6[3].field_0x18 = 4;
    *(undefined ***)plVar6 = &PTR__stream_buffer_0016fc10;
    memcpy(local_2f0,&local_140,0x84);
    lVar7 = 2;
    if (2 < lVar3) {
      lVar7 = lVar3;
    }
    if (lVar3 == -1) {
      lVar7 = 4;
    }
    *(long *)&plVar6[3].field_0x10 = lVar7;
    boost::iostreams::detail::basic_buffer<char,_std::allocator<char>_>::resize
              ((basic_buffer<char,_std::allocator<char>_> *)(plVar6 + 3),(long)((int)lVar7 + 0x2000)
              );
    (**(code **)(*(long *)plVar6 + 0xa8))(plVar6);
    memcpy(&plVar6->field_0x28 + 0x1c,local_2f0,0x84);
    plVar6[2].field_0x38 = 1;
    plVar6[3].field_0x18 = plVar6[3].field_0x18 | 1;
    (&plVar6->field_0x28)[0x18] = (byte)*(int *)(&plVar6->field_0x28 + 0x18) & 0xf8;
    local_2f0[0]._M_dataplus._M_p = (pointer)plVar6;
    std::__cxx11::
    list<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*>_>
    ::push_back(*(list<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<boost::iostreams::detail::linked_streambuf<char,_std::char_traits<char>_>_*>_>
                  **)this_00,(value_type *)local_2f0);
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 0x70))(plVar9,*(undefined8 *)(*(long *)(*(long *)this_00 + 8) + 0x10));
    }
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
    ::notify((chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
              *)this_00);
  }
  local_2f0[0]._M_string_length = chunk->size;
  local_2f0[0]._M_dataplus._M_p = (pointer)base;
  boost::iostreams::detail::
  chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  ::push_impl<stream::restricted_source<stream::slice_reader>>
            (this_00,(restricted_source<stream::slice_reader> *)local_2f0,-1,-1);
  return (__uniq_ptr_data<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

chunk_reader::pointer chunk_reader::get(slice_reader & base, const chunk & chunk , const std::string & key) {
	
	if(!base.seek(chunk.first_slice, chunk.offset)) {
		throw chunk_error("could not seek to chunk start");
	}
	
	char magic[sizeof(chunk_id)];
	if(base.read(magic, 4) != 4 || std::memcmp(magic, chunk_id, sizeof(chunk_id)) != 0) {
		throw chunk_error("bad chunk magic");
	}
	
	pointer result(new boost::iostreams::chain<boost::iostreams::input>);
	
	switch(chunk.compression) {
		case Stored: break;
		case Zlib:   result->push(io::zlib_decompressor(), 8192); break;
		case BZip2:  result->push(io::bzip2_decompressor(), 8192); break;
	#if INNOEXTRACT_HAVE_LZMA
		case LZMA1:  result->push(inno_lzma1_decompressor(), 8192); break;
		case LZMA2:  result->push(inno_lzma2_decompressor(), 8192); break;
	#else
		case LZMA1: case LZMA2:
			throw chunk_error("LZMA decompression not supported by this "
			                  + std::string(innoextract_name) + " build");
	#endif
		default: throw chunk_error("unknown chunk compression");
	}
	
	switch(chunk.encryption) {
		case Plaintext: break;
		#if INNOEXTRACT_HAVE_DECRYPTION
		case ARC4_MD5: /* fall-through */
		case ARC4_SHA1: {
			char salt[8];
			if(base.read(salt, 8) != 8) {
				throw chunk_error("could not read chunk salt");
			}
			crypto::hasher hasher(chunk.encryption == ARC4_SHA1 ? crypto::SHA1 : crypto::MD5);
			hasher.update(salt, sizeof(salt));
			hasher.update(key.c_str(), key.length());
			crypto::checksum checksum = hasher.finalize();
			const char * salted_key = chunk.encryption == ARC4_SHA1 ? checksum.sha1 : checksum.md5;
			size_t key_length = chunk.encryption == ARC4_SHA1 ? sizeof(checksum.sha1) : sizeof(checksum.md5);
			result->push(inno_arc4_crypter(salted_key, key_length), 8192);
			break;
		}
		case XChaCha20: {
			if(key.length() != crypto::xchacha20::key_size + crypto::xchacha20::nonce_size) {
				throw chunk_error("unexpected key size");
			}
			char nonce[crypto::xchacha20::nonce_size];
			std::memcpy(nonce, key.c_str() + crypto::xchacha20::key_size, crypto::xchacha20::nonce_size);
			util::little_endian::store(util::little_endian::load<boost::uint64_t>(nonce) ^ chunk.offset, nonce);
			util::little_endian::store(util::little_endian::load<boost::uint32_t>(nonce + 8) ^ chunk.first_slice, nonce + 8);
			result->push(inno_xchacha20_crypter(key.c_str(), nonce), 8192);
			break;
		}
		#else
		default: (void)key, throw chunk_error("XChaCha20 decryption not supported in this build");
		#endif
	}
	
	result->push(restrict(base, chunk.size));
	
	return result;
}